

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spikeestimator.cxx
# Opt level: O1

int __thiscall SpikeEstimator::init(SpikeEstimator *this,EVP_PKEY_CTX *ctx)

{
  int in_EAX;
  void *pvVar1;
  
  this->initA = false;
  this->initB = false;
  (this->super_Estimator).nSamples = 0;
  this->spkALast = 0;
  this->spkBLast = 0;
  this->spkDiffAB = 0;
  this->spkDiffBA = 0;
  if ((this->spkSample != (double *)0x0) && ((ulong)this->spkLength != 0)) {
    pvVar1 = memset(this->spkSample,0,(ulong)this->spkLength << 3);
    in_EAX = (int)pvVar1;
  }
  this->spkOne = 0.0;
  return in_EAX;
}

Assistant:

void SpikeEstimator::init()
{
    spkALast = 0;
    spkBLast = 0;
    spkDiffAB = 0;
    spkDiffBA = 0;
    initA = false;
    initB = false;

	nSamples = 0;
    if(spkSample)
        for(uint i=0; i<spkLength; i++)
            spkSample[i] = 0.0;
    spkOne = 0.0l;
}